

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::hufUnpackEncTable(char **pcode,int ni,int im,int iM,longlong *hcode)

{
  longlong lVar1;
  long lVar2;
  int lc;
  char *p;
  longlong c;
  
  memset(hcode,0,0x80008);
  p = *pcode;
  c = 0;
  lc = 0;
  for (; im <= iM; im = im + 1) {
    if ((long)ni < (long)p - (long)*pcode) goto LAB_0012084c;
    lVar1 = getBits(6,&c,&lc,&p);
    hcode[im] = lVar1;
    if (lVar1 == 0x3f) {
      if ((long)ni < (long)p - (long)*pcode) goto LAB_0012084c;
      lVar1 = getBits(8,&c,&lc,&p);
      if (iM + 1 < (int)lVar1 + im + 6) goto LAB_0012084c;
      for (lVar2 = 0; (int)lVar1 + 6 != (int)lVar2; lVar2 = lVar2 + 1) {
        hcode[im + lVar2] = 0;
      }
LAB_00120832:
      im = im + (int)lVar2 + -1;
    }
    else if (0x3a < lVar1) {
      if ((int)lVar1 + im + -0x39 <= iM + 1) {
        for (lVar2 = 0; (int)lVar1 + -0x39 != (int)lVar2; lVar2 = lVar2 + 1) {
          hcode[im + lVar2] = 0;
        }
        goto LAB_00120832;
      }
      goto LAB_0012084c;
    }
  }
  *pcode = p;
  hufCanonicalCodeTable(hcode);
LAB_0012084c:
  return iM < im;
}

Assistant:

bool hufUnpackEncTable(const char **pcode,  // io: ptr to packed table (updated)
                       int ni,              // i : input size (in bytes)
                       int im,              // i : min hcode index
                       int iM,              // i : max hcode index
                       long long *hcode)    //  o: encoding table [HUF_ENCSIZE]
{
  memset(hcode, 0, sizeof(long long) * HUF_ENCSIZE);

  const char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    if (p - *pcode > ni) {
      return false;
    }

    long long l = hcode[im] = getBits(6, c, lc, p);  // code length

    if (l == (long long)LONG_ZEROCODE_RUN) {
      if (p - *pcode > ni) {
        return false;
      }

      int zerun = getBits(8, c, lc, p) + SHORTEST_LONG_RUN;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    } else if (l >= (long long)SHORT_ZEROCODE_RUN) {
      int zerun = l - SHORT_ZEROCODE_RUN + 2;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    }
  }

  *pcode = const_cast<char *>(p);

  hufCanonicalCodeTable(hcode);

  return true;
}